

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtooltip.cpp
# Opt level: O0

void QToolTip::showText(QPoint *pos,QString *text,QWidget *w,QRect *rect,int msecDisplayTime)

{
  bool bVar1;
  QWidget *pos_00;
  QWidgetPrivate *w_00;
  QTipLabel *in_RCX;
  QWidget *in_RDX;
  QPoint *in_RSI;
  QPoint *in_RDI;
  undefined4 in_R8D;
  long in_FS_OFFSET;
  QLatin1StringView str;
  QWidget *tipLabelParent;
  undefined4 in_stack_00000030;
  QPoint localPos;
  QWidget *in_stack_000000a8;
  int in_stack_ffffffffffffff78;
  DirFlags in_stack_ffffffffffffff7c;
  QTipLabel *in_stack_ffffffffffffff80;
  QRect *in_stack_ffffffffffffff88;
  QTipLabel *this;
  undefined1 in_stack_ffffffffffffff90 [16];
  QPoint *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  int msecDisplayTime_00;
  QTipLabel *in_stack_ffffffffffffffd0;
  anon_class_8_1_54a39817 local_20;
  QPoint local_18;
  QPoint local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((QTipLabel::instance != (QTipLabel *)0x0) &&
     (bVar1 = QWidget::isVisible((QWidget *)0x4c15ef), bVar1)) {
    bVar1 = QString::isEmpty((QString *)0x4c1602);
    if (bVar1) {
      QTipLabel::hideTip(in_stack_ffffffffffffff80);
      goto LAB_004c182d;
    }
    if ((QTipLabel::instance->fadingOut & 1U) == 0) {
      local_10 = *in_RDI;
      if (in_RDX != (QWidget *)0x0) {
        local_18 = QWidget::mapFromGlobal
                             (in_stack_ffffffffffffff90._0_8_,(QPoint *)in_stack_ffffffffffffff88);
        local_10 = local_18;
      }
      bVar1 = QTipLabel::tipChanged
                        ((QTipLabel *)CONCAT44(in_R8D,in_stack_ffffffffffffffa8),
                         in_stack_ffffffffffffffa0,in_stack_ffffffffffffff90._8_8_,
                         in_stack_ffffffffffffff90._0_8_);
      if (bVar1) {
        QTipLabel::reuseTip(in_RCX,(QString *)CONCAT44(in_R8D,in_stack_ffffffffffffffa8),
                            (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                            in_stack_ffffffffffffff90._8_8_);
        QTipLabel::setTipRect
                  (in_stack_ffffffffffffff90._8_8_,in_stack_ffffffffffffff90._0_8_,
                   in_stack_ffffffffffffff88);
        QTipLabel::placeTip((QTipLabel *)rect,(QPoint *)CONCAT44(msecDisplayTime,in_stack_00000030),
                            in_stack_000000a8);
      }
      goto LAB_004c182d;
    }
  }
  msecDisplayTime_00 = (int)((ulong)in_RCX >> 0x20);
  bVar1 = QString::isEmpty((QString *)0x4c16e3);
  if (!bVar1) {
    pos_00 = showText::anon_class_8_1_54a39817::operator()(&local_20);
    operator_new(0x58);
    QTipLabel::QTipLabel
              (in_stack_ffffffffffffffd0,(QString *)in_RDI,in_RSI,in_RDX,msecDisplayTime_00);
    w_00 = QWidgetPrivate::get((QWidget *)0x4c1736);
    QTipLabel::getTipScreen((QPoint *)pos_00,in_stack_ffffffffffffff90._8_8_);
    QWidgetPrivate::setScreen
              ((QWidgetPrivate *)CONCAT44(in_R8D,in_stack_ffffffffffffffa8),(QScreen *)pos_00);
    QTipLabel::setTipRect
              (in_stack_ffffffffffffff90._8_8_,in_stack_ffffffffffffff90._0_8_,
               in_stack_ffffffffffffff88);
    QTipLabel::placeTip((QTipLabel *)rect,(QPoint *)CONCAT44(msecDisplayTime,in_stack_00000030),
                        in_stack_000000a8);
    this = QTipLabel::instance;
    str = Qt::Literals::StringLiterals::operator____L1((char *)QTipLabel::instance,(size_t)w_00);
    QAnyStringView::QAnyStringView((QAnyStringView *)this,str);
    QObject::setObjectName((QAnyStringView *)this);
    bVar1 = QApplication::isEffectEnabled((UIEffect)w_00);
    if (bVar1) {
      qFadeEffect((QWidget *)w_00,in_stack_ffffffffffffff7c);
    }
    else {
      bVar1 = QApplication::isEffectEnabled((UIEffect)w_00);
      if (bVar1) {
        qScrollEffect((QWidget *)w_00,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
      }
      else {
        QWidget::showNormal((QWidget *)this);
      }
    }
  }
LAB_004c182d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QToolTip::showText(const QPoint &pos, const QString &text, QWidget *w, const QRect &rect, int msecDisplayTime)
{
    if (QTipLabel::instance && QTipLabel::instance->isVisible()) { // a tip does already exist
        if (text.isEmpty()){ // empty text means hide current tip
            QTipLabel::instance->hideTip();
            return;
        } else if (!QTipLabel::instance->fadingOut) {
            // If the tip has changed, reuse the one
            // that is showing (removes flickering)
            QPoint localPos = pos;
            if (w)
                localPos = w->mapFromGlobal(pos);
            if (QTipLabel::instance->tipChanged(localPos, text, w)){
                QTipLabel::instance->reuseTip(text, msecDisplayTime, pos);
                QTipLabel::instance->setTipRect(w, rect);
                QTipLabel::instance->placeTip(pos, w);
            }
            return;
        }
    }

    if (!text.isEmpty()) { // no tip can be reused, create new tip:
        QWidget *tipLabelParent = [w]() -> QWidget* {
#ifdef Q_OS_WIN32
            // On windows, we can't use the widget as parent otherwise the window will be
            // raised when the tooltip will be shown
            Q_UNUSED(w);
            return nullptr;
#else
            return w;
#endif
        }();
        new QTipLabel(text, pos, tipLabelParent, msecDisplayTime); // sets QTipLabel::instance to itself
        QWidgetPrivate::get(QTipLabel::instance)->setScreen(QTipLabel::getTipScreen(pos, w));
        QTipLabel::instance->setTipRect(w, rect);
        QTipLabel::instance->placeTip(pos, w);
        QTipLabel::instance->setObjectName("qtooltip_label"_L1);

#if QT_CONFIG(effects)
        if (QApplication::isEffectEnabled(Qt::UI_FadeTooltip))
            qFadeEffect(QTipLabel::instance);
        else if (QApplication::isEffectEnabled(Qt::UI_AnimateTooltip))
            qScrollEffect(QTipLabel::instance);
        else
            QTipLabel::instance->showNormal();
#else
        QTipLabel::instance->showNormal();
#endif
    }
}